

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture2D::Texture2D(Texture2D *this,deUint32 name)

{
  rc::Texture::Texture(&this->super_Texture,name,TYPE_2D);
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture2D_01e70cd8
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  (this->m_view).m_numLevels = 0;
  (this->m_view).m_levels = (ConstPixelBufferAccess *)0x0;
  return;
}

Assistant:

Texture2D::Texture2D (deUint32 name)
	: Texture	(name, TYPE_2D)
	, m_view	(0, DE_NULL)
{
}